

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_bi_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  pel *ppVar10;
  long lVar11;
  byte bVar12;
  pel pVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined1 uVar31;
  int ref_up [128];
  int wy [128];
  int le [128];
  int up [128];
  undefined8 uStack_a38;
  uint auStack_838 [128];
  int aiStack_638 [128];
  int aiStack_438 [128];
  int aiStack_238 [130];
  
  bVar1 = g_tbl_log2[w];
  iVar24 = (int)(char)bVar1;
  bVar2 = g_tbl_log2[h];
  iVar23 = (int)(char)bVar2;
  bVar12 = bVar2 + 1 + bVar1;
  uVar16 = w * 2;
  iVar28 = iVar23 - iVar24;
  if ((char)bVar2 < (char)bVar1) {
    iVar28 = iVar24 - iVar23;
  }
  iVar28 = *(int *)(&DAT_00179a70 + (long)iVar28 * 4);
  uVar9 = 0;
  uVar14 = 0;
  if (0 < (int)uVar16) {
    uVar14 = (ulong)uVar16;
  }
  for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
    auStack_838[uVar9] = (uint)src[uVar9 + 2];
  }
  bVar7 = bVar2;
  if (iVar24 < iVar23) {
    bVar7 = bVar1;
  }
  lVar26 = (long)(h * 2);
  ppVar10 = src + -2;
  for (lVar15 = 0; lVar15 < lVar26; lVar15 = lVar15 + 2) {
    uVar31 = (undefined1)((ushort)*(undefined2 *)ppVar10 >> 8);
    *(ulong *)((long)&uStack_a38 + lVar15 * 4) =
         (ulong)(CONCAT14(uVar31,(uint)CONCAT12(uVar31,*(undefined2 *)ppVar10)) & 0xffffff00ff) &
         0xffffffff0000ffff;
    ppVar10 = ppVar10 + -2;
  }
  iVar23 = 1 << (bVar2 + bVar1 & 0x1f);
  lVar15 = (long)(int)uVar16;
  bVar3 = src[lVar15];
  uVar19 = (uint)bVar3;
  bVar4 = src[-lVar26];
  uVar16 = (uint)bVar4;
  if (w == h) {
    iVar24 = (uint)bVar4 + (uint)bVar3;
    uVar25 = (uint)bVar4 + (uint)bVar3 + 1 >> 1 & 0xff;
  }
  else {
    uVar25 = (int)((1 << (bVar7 + 5 & 0x1f)) +
                  ((uVar16 << (bVar2 & 0x1f)) + (uVar19 << (bVar1 & 0x1f))) * iVar28) >>
             (bVar7 + 6 & 0x1f);
    iVar24 = uVar16 + uVar19;
  }
  bVar3 = src[lVar15 + 1];
  uVar20 = (uint)bVar3;
  bVar4 = src[h * -2 + 1];
  uVar21 = (uint)bVar4;
  if (w == h) {
    iVar28 = (uint)bVar4 + (uint)bVar3;
    uVar18 = (uint)bVar4 + (uint)bVar3 + 1 >> 1 & 0xff;
  }
  else {
    uVar18 = (int)((1 << (bVar7 + 5 & 0x1f)) +
                  ((uVar21 << (bVar2 & 0x1f)) + (uVar20 << (bVar1 & 0x1f))) * iVar28) >>
             (bVar7 + 6 & 0x1f);
    iVar28 = uVar21 + uVar20;
  }
  uVar27 = ~(-1 << ((byte)bit_depth & 0x1f));
  for (lVar11 = 0; lVar11 < lVar15; lVar11 = lVar11 + 2) {
    uVar5 = auStack_838[lVar11];
    uVar6 = auStack_838[lVar11 + 1];
    aiStack_238[lVar11] = uVar16 - uVar5;
    aiStack_238[lVar11 + 1] = uVar21 - uVar6;
    auStack_838[lVar11] = uVar5 << (bVar2 & 0x1f);
    auStack_838[lVar11 + 1] = uVar6 << (bVar2 & 0x1f);
  }
  iVar17 = 0;
  iVar8 = 0;
  for (lVar11 = 0; lVar11 < lVar26; lVar11 = lVar11 + 2) {
    iVar29 = *(int *)((long)&uStack_a38 + lVar11 * 4);
    iVar30 = *(int *)((long)&uStack_a38 + lVar11 * 4 + 4);
    aiStack_438[lVar11] = uVar19 - iVar29;
    aiStack_438[lVar11 + 1] = uVar20 - iVar30;
    *(int *)((long)&uStack_a38 + lVar11 * 4) = iVar29 << (bVar1 & 0x1f);
    *(int *)((long)&uStack_a38 + lVar11 * 4 + 4) = iVar30 << (bVar1 & 0x1f);
    aiStack_638[lVar11] = iVar17;
    aiStack_638[lVar11 + 1] = iVar8;
    iVar8 = iVar8 + (uVar18 * 2 - iVar28);
    iVar17 = iVar17 + (uVar25 * 2 - iVar24);
  }
  uVar9 = (ulong)(uint)h;
  if (h < 1) {
    uVar9 = 0;
  }
  for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
    lVar22 = (long)(uVar14 << 0x21) >> 0x20;
    iVar28 = *(int *)((long)&uStack_a38 + ((long)(uVar14 << 0x21) >> 0x1e));
    lVar26 = (long)((int)uVar14 * 2 + 1);
    iVar24 = *(int *)((long)&uStack_a38 + lVar26 * 4);
    iVar8 = 0;
    iVar17 = 0;
    for (lVar11 = 0; lVar11 < lVar15; lVar11 = lVar11 + 2) {
      iVar28 = iVar28 + aiStack_438[lVar22];
      iVar29 = (int)*(undefined8 *)(auStack_838 + lVar11) +
               (int)*(undefined8 *)(aiStack_238 + lVar11);
      iVar30 = (int)((ulong)*(undefined8 *)(auStack_838 + lVar11) >> 0x20) +
               (int)((ulong)*(undefined8 *)(aiStack_238 + lVar11) >> 0x20);
      uVar19 = (iVar28 << (bVar2 & 0x1f)) + iVar8 + iVar23 + (iVar29 << (bVar1 & 0x1f)) >>
               (bVar12 & 0x1f);
      iVar24 = iVar24 + aiStack_438[lVar26];
      uVar25 = (iVar24 << (bVar2 & 0x1f)) + iVar17 + iVar23 + (iVar30 << (bVar1 & 0x1f)) >>
               (bVar12 & 0x1f);
      *(ulong *)(auStack_838 + lVar11) = CONCAT44(iVar30,iVar29);
      uVar16 = uVar19;
      if ((int)uVar27 <= (int)uVar19) {
        uVar16 = uVar27;
      }
      pVar13 = (pel)uVar16;
      if ((int)uVar19 < 0) {
        pVar13 = '\0';
      }
      dst[lVar11] = pVar13;
      uVar16 = uVar25;
      if ((int)uVar27 <= (int)uVar25) {
        uVar16 = uVar27;
      }
      pVar13 = (pel)uVar16;
      if ((int)uVar25 < 0) {
        pVar13 = '\0';
      }
      dst[lVar11 + 1] = pVar13;
      iVar8 = iVar8 + aiStack_638[lVar22];
      iVar17 = iVar17 + aiStack_638[lVar26];
    }
    dst = dst + i_dst;
  }
  return;
}

Assistant:

void ipred_bi_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int x, y;
    int ishift_x = g_tbl_log2[w];
    int ishift_y = g_tbl_log2[h];
    int ishift = COM_MIN(ishift_x, ishift_y);
    int ishift_xy = ishift_x + ishift_y + 1;
    int offset = 1 << (ishift_x + ishift_y);
    int a_u, b_u, c_u, wt_u, tmp_u;
    int a_v, b_v, c_v, wt_v, tmp_v;
    int ref_up[MAX_CU_SIZE], ref_le[MAX_CU_SIZE], up[MAX_CU_SIZE], le[MAX_CU_SIZE], wy[MAX_CU_SIZE];
    int wc, tbl_wc[6] = { -1, 21, 13, 7, 4, 2 };
    int w2 = w << 1;
    int h2 = h << 1;
    int max_pel = (1 << bit_depth) - 1;
    int val_u, val_v;

    wc = ishift_x > ishift_y ? ishift_x - ishift_y : ishift_y - ishift_x;
    uavs3d_assert(wc <= 5);

    wc = tbl_wc[wc];
    for (x = 0; x < w2; x++) {
        ref_up[x] = src[x + 2];  
    }
    for (y = 0; y < h2; y += 2) {
        ref_le[y    ] = src[-y - 2];
        ref_le[y + 1] = src[-y - 1];
    }

    a_u = src[w2];
    b_u = src[-h2];
    c_u = (w == h) ? (a_u + b_u + 1) >> 1 : (((a_u << ishift_x) + (b_u << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_u = (c_u << 1) - a_u - b_u;

    a_v = src[w2 + 1];
    b_v = src[-h2 + 1];
    c_v = (w == h) ? (a_v + b_v + 1) >> 1 : (((a_v << ishift_x) + (b_v << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_v = (c_v << 1) - a_v - b_v;

    for (x = 0; x < w2; x += 2) {
        up[x    ] = b_u - ref_up[x];
        up[x + 1] = b_v - ref_up[x + 1];
        ref_up[x    ] <<= ishift_y;
        ref_up[x + 1] <<= ishift_y;
    }
    tmp_u = tmp_v = 0;
    for (y = 0; y < h2; y += 2) {
        le[y    ] = a_u - ref_le[y];
        le[y + 1] = a_v - ref_le[y + 1];
        ref_le[y    ] <<= ishift_x;
        ref_le[y + 1] <<= ishift_x;
        wy[y    ] = tmp_u;
        wy[y + 1] = tmp_v;
        tmp_u += wt_u;
        tmp_v += wt_v;
    }
    for (y = 0; y < h; y++) {
        int y2 = y << 1;
        int predx_u = ref_le[y2    ];
        int predx_v = ref_le[y2 + 1];
        int wxy_u = 0;
        int wxy_v = 0;
        for (x = 0; x < w2; x += 2) {
            predx_u += le[y2];
            predx_v += le[y2 + 1];
            ref_up[x    ] += up[x];
            ref_up[x + 1] += up[x + 1];
            val_u = ((predx_u << ishift_y) + (ref_up[x    ] << ishift_x) + wxy_u + offset) >> ishift_xy;
            val_v = ((predx_v << ishift_y) + (ref_up[x + 1] << ishift_x) + wxy_v + offset) >> ishift_xy;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
            wxy_u += wy[y2];
            wxy_v += wy[y2 + 1];
        }
        dst += i_dst;
    }
}